

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

TestResult * tcase_run_tfun_nofork(SRunner *sr,TCase *tc,TF *tfun,int i)

{
  List *fixture_list;
  TTest *pTVar1;
  fork_status fork_usage;
  clockid_t cVar2;
  int iVar3;
  TestResult *pTVar4;
  timespec ts_start;
  timespec ts_end;
  timespec local_48;
  timespec local_38;
  
  local_48.tv_sec = 0;
  local_48.tv_nsec = 0;
  local_38.tv_sec = 0;
  local_38.tv_nsec = 0;
  fixture_list = tc->ch_sflst;
  fork_usage = srunner_fork_status(sr);
  pTVar4 = srunner_run_setup(fixture_list,fork_usage,tc->name,"checked_setup");
  if (pTVar4 == (TestResult *)0x0) {
    cVar2 = check_get_clockid();
    clock_gettime(cVar2,&local_48);
    iVar3 = _setjmp((__jmp_buf_tag *)error_jmp_buffer);
    if (iVar3 == 0) {
      pTVar1 = tfun->ttest;
      tcase_fn_start(pTVar1->name,pTVar1->file,pTVar1->line);
      (*tfun->ttest->fn)(i);
    }
    cVar2 = check_get_clockid();
    clock_gettime(cVar2,&local_38);
    srunner_run_teardown(tc->ch_tflst,CK_NOFORK);
    pTVar4 = receive_result_info_nofork
                       (tc->name,tfun->ttest->name,i,
                        ((int)(SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8) >>
                              7) -
                        (SUB164(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),0xc) >>
                        0x1f)) + ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) *
                                               SEXT816(local_38.tv_nsec),8) >> 7) -
                                 (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),0xc
                                        ) >> 0x1f)) +
                        ((int)local_38.tv_sec - (int)local_48.tv_sec) * 1000000);
  }
  return pTVar4;
}

Assistant:

static TestResult *tcase_run_tfun_nofork(SRunner * sr, TCase * tc, TF * tfun,
                                         int i)
{
    TestResult *tr;
    struct timespec ts_start = {0, 0}, ts_end = {0, 0};

    tr = tcase_run_checked_setup(sr, tc);
    if(tr == NULL)
    {
        clock_gettime(check_get_clockid(), &ts_start);
        if(0 == setjmp(error_jmp_buffer))
        {
            tcase_fn_start(tfun->ttest->name, tfun->ttest->file, tfun->ttest->line);
            tfun->ttest->fn(i);
        }
        clock_gettime(check_get_clockid(), &ts_end);
        tcase_run_checked_teardown(tc);
        return receive_result_info_nofork(tc->name, tfun->ttest->name, i,
                                          DIFF_IN_USEC(ts_start, ts_end));
    }

    return tr;
}